

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libSupport.c
# Opt level: O0

void call_ends(Abc_Frame_t *pAbc)

{
  code *pcVar1;
  lib_init_end_func end_func;
  int i;
  Abc_Frame_t *pAbc_local;
  
  for (end_func._4_4_ = 0; libHandles[(int)end_func._4_4_] != (void *)0x0;
      end_func._4_4_ = end_func._4_4_ + 1) {
    pcVar1 = (code *)get_fnct_ptr(end_func._4_4_,"abc_end");
    if (pcVar1 == (code *)0x0) {
      printf("Warning: Failed to end library %d.\n",(ulong)end_func._4_4_);
    }
    else {
      (*pcVar1)(pAbc);
    }
  }
  return;
}

Assistant:

void call_ends(Abc_Frame_t* pAbc) {
    int i;
    lib_init_end_func end_func;
    for (i = 0; libHandles[i] != 0; i++) {
        end_func = (lib_init_end_func) get_fnct_ptr(i, "abc_end");
        if (end_func == 0) {
            printf("Warning: Failed to end library %d.\n", i);
        } else {
            (*end_func)(pAbc);
        }
    }
}